

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O3

char * strscat(char *dest,char *src,size_t size)

{
  size_t sVar1;
  
  if ((size != 0 && (src != (char *)0x0 && dest != (char *)0x0)) && (*src != '\0')) {
    sVar1 = strlen(dest);
    if (sVar1 < size) {
      strncpy(dest + sVar1,src,~sVar1 + size);
      (dest + sVar1)[~sVar1 + size] = '\0';
    }
  }
  return dest;
}

Assistant:

char *
strscat(char *dest, const char *src, size_t size) {
  size_t l;

  if (dest == NULL || src == NULL || size == 0 || *src == 0) {
    return dest;
  }

  l = strlen(dest);
  if (l < size) {
    strscpy(dest + l, src, size - l);
  }
  return dest;
}